

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar11;
  pointer pcVar12;
  double dVar13;
  pointer pMVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined8 uVar19;
  Interval *pIVar20;
  IVal *pIVar21;
  undefined8 *puVar22;
  float *ival;
  undefined1 *puVar23;
  Matrix<float,_4,_4> *val;
  int row;
  long lVar24;
  string *msg;
  TestStatus *pTVar25;
  FloatFormat *pFVar26;
  long lVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  long lVar29;
  IVal in2;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  outputs;
  void *outputArr [2];
  FuncSet funcs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  IVal in0;
  IVal in1;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff7e8;
  string local_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7f0;
  size_t local_7e8;
  string local_7e0;
  ulong local_7c0;
  FloatFormat *local_7b8;
  TestStatus *local_7b0;
  FloatFormat local_7a8;
  long local_780;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_778;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  local_748;
  pointer local_718;
  pointer local_710;
  undefined1 local_708 [12];
  YesNoMaybe YStack_6fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  _Rb_tree_node_base *local_6e8;
  double local_6e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_6d8;
  undefined4 local_6d0;
  ios_base local_690 [264];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_588;
  pointer local_528;
  pointer local_520;
  pointer local_518;
  pointer local_510;
  undefined1 local_500 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0 [6];
  ios_base local_490 [8];
  ios_base local_488 [264];
  undefined1 local_380 [16];
  undefined1 local_370 [376];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [384];
  
  this_00 = this->m_samplings;
  pFVar26 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_7b0 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_7b8 = pFVar26;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_588,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar26,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffff7e8);
  pMVar14 = local_588.in0.
            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7e8 = (long)local_588.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_588.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>::
  Outputs(&local_748,local_7e8);
  local_7a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_7a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_7a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_7a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_7a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_7a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_7a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_7a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_7a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_778._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_778._M_impl.super__Rb_tree_header._M_header;
  local_778._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_778._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_778._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_778._M_impl.super__Rb_tree_header._M_header._M_right =
       local_778._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector((ResultCollector *)(local_370 + 0x170));
  local_7f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_528 = local_588.in0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_520 = local_588.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_518 = local_588.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_510 = local_588.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_718 = local_748.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_710 = local_748.out1.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_500 + 8);
  local_500._0_8_ = local_7f0;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_488);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  p_Var5 = (_Rb_tree_node_base *)(local_708 + 8);
  local_708._8_4_ = _S_red;
  local_6f8._M_allocated_capacity = 0;
  local_6e0 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_6f8._8_8_ = p_Var5;
  local_6e8 = p_Var5;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_708);
  if ((_Rb_tree_node_base *)local_6f8._8_8_ != p_Var5) {
    uVar19 = local_6f8._8_8_;
    do {
      (**(code **)(**(long **)(uVar19 + 0x20) + 0x30))(*(long **)(uVar19 + 0x20),local_1b0);
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
    } while ((_Rb_tree_node_base *)uVar19 != p_Var5);
  }
  pFVar26 = local_7b8;
  if (local_6e0 != 0.0) {
    poVar4 = (ostringstream *)(local_500 + 8);
    local_500._0_8_ = local_7f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_380._0_8_,local_380._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_380._0_8_ != local_370) {
      operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_488);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_708);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  ival = (float *)&local_718;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_7e8,&local_528,ival,0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_500);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b0);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_708);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_500);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_380);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_810);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_778,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_7e0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_1b0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_778,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_708);
  if (local_588.in0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
LAB_00942e96:
    poVar4 = (ostringstream *)(local_500 + 8);
    local_500._0_8_ = local_7f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar25 = local_7b0;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_488);
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"Pass","");
    pTVar25->m_code = QP_TEST_RESULT_PASS;
    (pTVar25->m_description)._M_dataplus._M_p = (pointer)&(pTVar25->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar25->m_description,local_500._0_8_,local_500._0_8_ + local_500._8_8_);
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._0_8_ == local_4f0) goto LAB_00943079;
  }
  else {
    local_780 = local_7e8 + (local_7e8 == 0);
    lVar29 = 0;
    local_7c0 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_500);
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b0);
      round<tcu::Matrix<float,4,4>>
                ((IVal *)local_380,(shaderexecutor *)pFVar26,
                 (FloatFormat *)
                 (local_588.in0.
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar29),(Matrix<float,_4,_4> *)ival);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_708,pFVar26,(IVal *)local_380);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      puVar23 = local_708;
      lVar24 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar27) = *(undefined8 *)(puVar23 + lVar27 + 0x10);
          dVar13 = *(double *)((long)(puVar23 + lVar27) + 8);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar27;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar23 + lVar27);
          *(double *)(pbVar2 + 8) = dVar13;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar24 = lVar24 + 1;
        pIVar20 = pIVar20 + 1;
        puVar23 = puVar23 + 0x18;
      } while (lVar24 != 4);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_778,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_6e8 = (_Rb_tree_node_base *)pFVar26->m_maxValue;
      local_708._0_8_ = *(undefined8 *)pFVar26;
      local_708._8_4_ = pFVar26->m_fractionBits;
      YStack_6fc = pFVar26->m_hasSubnormal;
      local_6f8._M_allocated_capacity = *(undefined8 *)&pFVar26->m_hasInf;
      local_6f8._8_8_ = *(undefined8 *)&pFVar26->m_exactPrecision;
      local_6e0 = (double)CONCAT44(local_6e0._4_4_,(this->m_caseCtx).precision);
      local_6d0 = 0;
      pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      pIVar20 = (Interval *)local_708;
      local_6d8 = &local_778;
      (*pSVar9->_vptr_Statement[3])(pSVar9,pIVar20);
      pIVar21 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)pIVar20,&local_7a8,pIVar21);
      puVar23 = local_1b0;
      lVar24 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar23 + lVar27 + 0x10) = *(undefined8 *)((long)&pIVar20->m_hi + lVar27);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar27;
          dVar13 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar23 + lVar27) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar23 + lVar27) + 8) = dVar13;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar24 = lVar24 + 1;
        puVar23 = puVar23 + 0x18;
        pIVar20 = pIVar20 + 1;
      } while (lVar24 != 4);
      bVar15 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_1b0,
                          local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar29);
      local_708._0_8_ = &local_6f8;
      msg = (string *)local_708;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)msg,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check((ResultCollector *)(local_370 + 0x170),bVar15,msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._0_8_ != &local_6f8) {
        operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._M_allocated_capacity + 1));
      }
      pIVar21 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_778,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)msg,&local_7a8,pIVar21);
      ival = (float *)local_500;
      lVar24 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)((long)ival + lVar27 + 0x10) =
               *(undefined8 *)((long)&msg->field_2 + lVar27);
          puVar22 = (undefined8 *)((long)&(msg->_M_dataplus)._M_p + lVar27);
          uVar19 = puVar22[1];
          *(undefined8 *)((long)ival + lVar27) = *puVar22;
          ((undefined8 *)((long)ival + lVar27))[1] = uVar19;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar24 = lVar24 + 1;
        ival = ival + 6;
        msg = (string *)((msg->field_2)._M_local_buf + 8);
      } while (lVar24 != 4);
      bVar16 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_500,
                          local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar29);
      local_708._0_8_ = &local_6f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_708,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_370 + 0x170),bVar16,(string *)local_708);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._0_8_ != &local_6f8) {
        operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._M_allocated_capacity + 1));
      }
      pFVar26 = local_7b8;
      if ((!bVar15 || !bVar16) &&
         (uVar18 = (int)local_7c0 + 1, local_7c0 = (ulong)uVar18, (int)uVar18 < 0x65)) {
        local_708._0_8_ = local_7f0;
        poVar4 = (ostringstream *)(local_708 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        val = (Matrix<float,_4,_4> *)local_370;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_380._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_708 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_810,(shaderexecutor *)&local_7a8,
                   (FloatFormat *)
                   (local_588.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar29),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_708 + 8),local_810._M_dataplus._M_p,local_810._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_4> *)local_380._0_8_ != (Matrix<float,_4,_4> *)local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8),"\t",1);
        pVVar11 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        pIVar21 = (IVal *)local_370;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_380._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_708 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_810,(shaderexecutor *)&local_7a8,
                   (FloatFormat *)
                   (local_748.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar29),
                   (Matrix<float,_4,_4> *)pIVar21);
        poVar6 = (ostream *)(local_708 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_810._M_dataplus._M_p,local_810._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_7e0,(shaderexecutor *)&local_7a8,(FloatFormat *)local_500,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_708 + 8),local_7e0._M_dataplus._M_p,local_7e0._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
          operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_380._0_8_ != (IVal *)local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8),"\t",1);
        pVVar11 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        ival = (float *)local_370;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_380._0_8_ = ival;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_708 + 8),(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_708 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_810,(shaderexecutor *)&local_7a8,
                   (FloatFormat *)
                   (local_748.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar29),(Matrix<float,_4,_4> *)ival)
        ;
        poVar6 = (ostream *)(local_708 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_810._M_dataplus._M_p,local_810._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_7e0,(shaderexecutor *)&local_7a8,(FloatFormat *)local_1b0,(IVal *)ival);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_7e0._M_dataplus._M_p,local_7e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
          operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_380._0_8_ != local_370) {
          operator_delete((void *)local_380._0_8_,local_370._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_708,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_708 + 8));
        std::ios_base::~ios_base(local_690);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 != local_780);
    iVar17 = (int)local_7c0;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_00942e96;
    }
    else {
      poVar4 = (ostringstream *)(local_500 + 8);
      local_500._0_8_ = local_7f0;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar17 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_488);
    }
    poVar4 = (ostringstream *)(local_500 + 8);
    local_500._0_8_ = local_7f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_500,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_488);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::ostream::operator<<(local_500,iVar17);
    pTVar25 = local_7b0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_500," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)(local_500._8_8_ + CONCAT44(YStack_6fc,local_708._8_4_));
    uVar19 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._0_8_ != &local_6f8) {
      uVar19 = local_6f8._M_allocated_capacity;
    }
    if ((ulong)uVar19 < p_Var3) {
      uVar19 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._0_8_ != local_4f0) {
        uVar19 = local_4f0[0]._M_allocated_capacity;
      }
      if ((ulong)uVar19 < p_Var3) goto LAB_00942e84;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_500,0,(char *)0x0,local_708._0_8_);
    }
    else {
LAB_00942e84:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_708,local_500._0_8_);
    }
    local_1b0._0_8_ = local_1b0 + 0x10;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1b0._16_8_ = *pdVar1;
      local_1b0._24_4_ = *(undefined4 *)(puVar22 + 3);
      local_1b0._28_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1b0._16_8_ = *pdVar1;
      local_1b0._0_8_ = (double *)*puVar22;
    }
    local_1b0._8_8_ = puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar25->m_code = QP_TEST_RESULT_FAIL;
    (pTVar25->m_description)._M_dataplus._M_p = (pointer)&(pTVar25->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar25->m_description,local_1b0._0_8_,
               (undefined1 *)(local_1b0._8_8_ + local_1b0._0_8_));
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_,(ulong)(local_4f0[0]._M_allocated_capacity + 1));
    }
    local_4f0[0]._M_allocated_capacity = local_6f8._M_allocated_capacity;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_708._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._0_8_ == &local_6f8) goto LAB_00943079;
  }
  operator_delete(paVar28,(ulong)((long)&((_Base_ptr)local_4f0[0]._0_8_)->_M_color + 1));
LAB_00943079:
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0._M_allocated_capacity + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_778);
  if (local_748.out1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_748.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.in0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar25;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}